

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

size_t ptls_aead_encrypt(ptls_aead_context_t *ctx,void *output,void *input,size_t inlen,uint64_t seq
                        ,void *aad,size_t aadlen)

{
  char cVar1;
  byte bVar6;
  byte bVar10;
  short sVar12;
  ushort uVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  unkbyte10 Var18;
  undefined1 auVar19 [12];
  undefined1 auVar20 [14];
  ulong uVar21;
  undefined4 uVar22;
  short sVar23;
  ulong *puVar24;
  size_t sVar25;
  size_t sVar26;
  uint8_t *__src;
  char cVar27;
  char cVar28;
  ulong uVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  ulong uVar32;
  undefined1 auVar33 [14];
  ulong uVar34;
  ulong uStack_60;
  undefined1 auStack_58 [24];
  void *local_40;
  size_t local_38;
  byte bVar2;
  char cVar3;
  byte bVar4;
  char cVar5;
  byte bVar7;
  char cVar8;
  char cVar9;
  byte bVar11;
  
  puVar24 = (ulong *)auStack_58;
  sVar25 = ctx->algo->iv_size;
  __src = ctx->static_iv;
  local_40 = input;
  local_38 = inlen;
  if (sVar25 - 8 != 0) {
    uStack_60 = 0x116be4;
    memcpy(auStack_58,__src,sVar25 - 8);
    __src = ctx->static_iv + (sVar25 - 8);
    puVar24 = (ulong *)((long)&uStack_60 + sVar25);
  }
  auVar31._0_8_ = seq >> 8;
  auVar31._8_8_ = seq;
  auVar31 = auVar31 & _DAT_0012a3e0;
  uVar32 = (ulong)DAT_0012a3e0;
  uVar21 = seq >> 0x18 & uVar32;
  uVar34 = DAT_0012a3e0._8_8_;
  uVar29 = seq >> 0x10 & uVar34;
  cVar27 = (char)(uVar29 >> 0x10);
  cVar28 = (char)(uVar29 >> 0x20);
  Var18 = CONCAT19((char)(uVar29 >> 8),CONCAT18((char)uVar29,uVar21));
  auVar19[10] = cVar27;
  auVar19._0_10_ = Var18;
  auVar19[0xb] = (char)(uVar29 >> 0x18);
  auVar20[0xc] = cVar28;
  auVar20._0_12_ = auVar19;
  auVar20[0xd] = (char)(uVar29 >> 0x28);
  sVar12 = (short)uVar21;
  cVar1 = (0 < sVar12) * (sVar12 < 0x100) * (char)uVar21 - (0xff < sVar12);
  sVar12 = (short)(uVar21 >> 0x10);
  uVar13 = (ushort)(uVar21 >> 0x20);
  bVar2 = (uVar13 != 0) * (uVar13 < 0x100) * (char)(uVar21 >> 0x20) - (0xff < uVar13);
  sVar14 = (short)((unkuint10)Var18 >> 0x40);
  cVar3 = (0 < sVar14) * (sVar14 < 0x100) * (char)uVar29 - (0xff < sVar14);
  sVar15 = auVar19._10_2_;
  sVar14 = auVar20._12_2_;
  bVar4 = (0 < sVar14) * (sVar14 < 0x100) * cVar28 - (0xff < sVar14);
  sVar14 = auVar31._0_2_;
  cVar28 = (0 < sVar14) * (sVar14 < 0x100) * auVar31[0] - (0xff < sVar14);
  sVar16 = auVar31._2_2_;
  sVar14 = auVar31._4_2_;
  cVar5 = (0 < sVar14) * (sVar14 < 0x100) * auVar31[4] - (0xff < sVar14);
  sVar17 = auVar31._6_2_;
  uVar29 = seq >> 0x28 & uVar32;
  uVar30 = (ulong)(((unkuint9)(uint)(seq >> 0x20) << 0x28) >> 0x28) & uVar34;
  uVar32 = seq >> 0x38 & uVar32;
  uVar34 = (ulong)(((unkuint9)(ushort)(seq >> 0x30) << 0x38) >> 0x38) & uVar34;
  uVar13 = (ushort)uVar32;
  bVar6 = (uVar13 != 0) * (uVar13 < 0x100) * (char)uVar32 - (0xff < uVar13);
  sVar14 = (short)uVar34;
  bVar7 = (0 < sVar14) * (sVar14 < 0x100) * (char)uVar34 - (0xff < sVar14);
  sVar14 = (short)uVar29;
  cVar8 = (0 < sVar14) * (sVar14 < 0x100) * (char)uVar29 - (0xff < sVar14);
  uVar13 = (ushort)(uVar29 >> 0x10);
  uVar13 = CONCAT11((uVar13 != 0) * (uVar13 < 0x100) * (char)(uVar29 >> 0x10) - (0xff < uVar13),
                    cVar8);
  auVar33._0_12_ = ZEXT212(uVar13) << 0x40;
  sVar14 = (short)uVar30;
  cVar9 = (0 < sVar14) * (sVar14 < 0x100) * (char)uVar30 - (0xff < sVar14);
  auVar33[0xc] = cVar9;
  sVar14 = (short)(uVar30 >> 0x10);
  auVar33[0xd] = (0 < sVar14) * (sVar14 < 0x100) * (char)(uVar30 >> 0x10) - (0xff < sVar14);
  sVar14 = CONCAT11((0 < sVar12) * (sVar12 < 0x100) * (char)(uVar21 >> 0x10) - (0xff < sVar12),cVar1
                   );
  sVar23 = CONCAT11((0 < sVar15) * (sVar15 < 0x100) * cVar27 - (0xff < sVar15),cVar3);
  sVar15 = CONCAT11((0 < sVar16) * (sVar16 < 0x100) * auVar31[2] - (0xff < sVar16),cVar28);
  bVar6 = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6);
  bVar7 = (bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7);
  bVar10 = (0 < (short)uVar13) * ((short)uVar13 < 0x100) * cVar8 - (0xff < (short)uVar13);
  sVar12 = auVar33._12_2_;
  bVar11 = (0 < sVar12) * (sVar12 < 0x100) * cVar9 - (0xff < sVar12);
  cVar1 = (0 < sVar14) * (sVar14 < 0x100) * cVar1 - (0xff < sVar14);
  sVar16 = CONCAT11((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2),cVar1);
  cVar3 = (0 < sVar23) * (sVar23 < 0x100) * cVar3 - (0xff < sVar23);
  uVar22 = CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),CONCAT12(cVar3,sVar16));
  cVar28 = (0 < sVar15) * (sVar15 < 0x100) * cVar28 - (0xff < sVar15);
  sVar14 = (short)(CONCAT13((0 < sVar17) * (sVar17 < 0x100) * auVar31[6] - (0xff < sVar17),
                            CONCAT12(cVar5,sVar15)) >> 0x10);
  sVar12 = (short)((uint)uVar22 >> 0x10);
  sVar14 = (short)(CONCAT15((0 < sVar14) * (sVar14 < 0x100) * cVar5 - (0xff < sVar14),
                            CONCAT14(cVar28,uVar22)) >> 0x20);
  *puVar24 = (ulong)CONCAT16((0 < sVar14) * (sVar14 < 0x100) * cVar28 - (0xff < sVar14),
                             CONCAT15((0 < sVar12) * (sVar12 < 0x100) * cVar3 - (0xff < sVar12),
                                      CONCAT14((0 < sVar16) * (sVar16 < 0x100) * cVar1 -
                                               (0xff < sVar16),
                                               CONCAT13((bVar11 != 0) * (bVar11 < 0x100) * bVar11 -
                                                        (0xff < bVar11),
                                                        CONCAT12((bVar10 != 0) * (bVar10 < 0x100) *
                                                                 bVar10 - (0xff < bVar10),
                                                                 CONCAT11((bVar7 != 0) *
                                                                          (bVar7 < 0x100) * bVar7 -
                                                                          (0xff < bVar7),
                                                                          (bVar6 != 0) *
                                                                          (bVar6 < 0x100) * bVar6 -
                                                                          (0xff < bVar6))))))) ^
             *(ulong *)__src;
  uStack_60 = 0x116c89;
  (*ctx->do_encrypt_init)(ctx,auStack_58,aad,aadlen);
  uStack_60 = 0x116c9c;
  sVar25 = (*ctx->do_encrypt_update)(ctx,output,local_40,local_38);
  uStack_60 = 0x116cab;
  sVar26 = (*ctx->do_encrypt_final)(ctx,(void *)((long)output + sVar25));
  return sVar26 + sVar25;
}

Assistant:

size_t ptls_aead_encrypt(ptls_aead_context_t *ctx, void *output, const void *input, size_t inlen, uint64_t seq, const void *aad,
                         size_t aadlen)
{
    size_t off = 0;

    ptls_aead_encrypt_init(ctx, seq, aad, aadlen);
    off += ptls_aead_encrypt_update(ctx, ((uint8_t *)output) + off, input, inlen);
    off += ptls_aead_encrypt_final(ctx, ((uint8_t *)output) + off);

    return off;
}